

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fshook_stdio.c
# Opt level: O1

_Bool fs_stdio_change_directory(char *path)

{
  int iVar1;
  int *piVar2;
  
  iVar1 = chdir(path);
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    al_set_errno(*piVar2);
  }
  return iVar1 != -1;
}

Assistant:

static bool fs_stdio_change_directory(const char *path)
{
   int ret = -1;

#ifdef ALLEGRO_WINDOWS
   wchar_t *wpath = _al_win_utf8_to_utf16(path);
   if (wpath) {
      ret = _wchdir(wpath);
      al_free(wpath);
   }
#else
   ret = chdir(path);
#endif

   if (ret == -1) {
      al_set_errno(errno);
      return false;
   }

   return true;
}